

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void errline(int n,int k,FILE *err)

{
  size_t sVar1;
  ulong uVar2;
  char *__format;
  long lVar3;
  ulong uVar4;
  char **ppcVar5;
  
  fputs(*argv,(FILE *)err);
  ppcVar5 = argv;
  sVar1 = strlen(*argv);
  lVar3 = (long)((int)sVar1 + 1);
  uVar2 = 1;
  if (1 < n) {
    uVar2 = 1;
    do {
      if (ppcVar5[uVar2] == (char *)0x0) goto LAB_0010a5ed;
      fprintf((FILE *)err," %s");
      ppcVar5 = argv;
      sVar1 = strlen(argv[uVar2]);
      lVar3 = lVar3 + ((long)((sVar1 << 0x20) + 0x100000000) >> 0x20);
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
    uVar2 = (ulong)(uint)n;
LAB_0010a5ed:
    uVar2 = uVar2 & 0xffffffff;
  }
  uVar4 = k + lVar3;
  if (ppcVar5[uVar2] != (char *)0x0) {
    lVar3 = uVar2 * 8;
    do {
      lVar3 = lVar3 + 8;
      fprintf((FILE *)err," %s");
    } while (*(long *)((long)argv + lVar3) != 0);
  }
  if (uVar4 < 0x14) {
    __format = "\n%*s^-- here\n";
  }
  else {
    uVar4 = (ulong)((int)uVar4 - 7);
    __format = "\n%*shere --^\n";
  }
  fprintf((FILE *)err,__format,uVar4 & 0xffffffff,"");
  return;
}

Assistant:

static void errline(int n, int k, FILE *err)
{
  int i;
  size_t spcnt;
  if( argv[0] ) fprintf(err,"%s",argv[0]);
  spcnt = lemonStrlen(argv[0]) + 1;
  for(i=1; i<n && argv[i]; i++){
    fprintf(err," %s",argv[i]);
    spcnt += lemonStrlen(argv[i])+1;
  }
  spcnt += k;
  for(; argv[i]; i++) fprintf(err," %s",argv[i]);
  if( spcnt<20 ){
    fprintf(err,"\n%*s^-- here\n",(int)spcnt,"");
  }else{
    fprintf(err,"\n%*shere --^\n",(int)spcnt-7,"");
  }
}